

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeitems.cpp
# Opt level: O1

int AF_A_RemoveForceField(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  PClass *pPVar6;
  undefined8 uVar7;
  PClass *pPVar8;
  long lVar9;
  undefined4 in_register_00000014;
  VMValue *pVVar10;
  long lVar11;
  char *__assertion;
  bool bVar12;
  undefined1 auVar13 [16];
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  uVar7 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005d0364;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    pVVar10 = param;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        auVar13 = (**(code **)*puVar2)(puVar2);
        uVar7 = auVar13._8_8_;
        puVar2[1] = auVar13._0_8_;
      }
      pPVar8 = (PClass *)puVar2[1];
      bVar12 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar12;
      uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),bVar12);
      pVVar10 = (VMValue *)(ulong)(pPVar8 == pPVar6 || bVar12);
      if (pPVar8 != pPVar6 && !bVar12) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar6) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d0364;
      }
    }
    pPVar6 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d0339;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar7 = (**(code **)*puVar3)(puVar3,pVVar10,uVar7,ret);
          puVar3[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar3[1];
        bVar12 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar6 && bVar12) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar12 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar6) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar12) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d0364;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      *(byte *)((long)puVar2 + 0x18c) = *(byte *)((long)puVar2 + 0x18c) & 0xfe;
      lVar9 = (long)*(short *)(puVar2[0x22] + 0x196);
      if (0 < lVar9) {
        lVar4 = *(long *)(puVar2[0x22] + 0x198);
        lVar11 = 0;
        do {
          lVar5 = *(long *)(lVar4 + lVar11 * 8);
          if ((*(long *)(lVar5 + 0x80) != 0) && (*(int *)(lVar5 + 0x28) == 0x21)) {
            *(uint *)(lVar5 + 0x20) = *(uint *)(lVar5 + 0x20) & 0xffff7ffe;
            *(undefined4 *)(lVar5 + 0x28) = 0;
            *(undefined4 *)(*(long *)(lVar5 + 0x48) + 0x60) = 0;
            *(undefined4 *)(*(long *)(lVar5 + 0x50) + 0x60) = 0;
          }
          lVar11 = lVar11 + 1;
        } while (lVar9 != lVar11);
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d0339:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d0364:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeitems.cpp"
                ,0x1a,"int AF_A_RemoveForceField(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveForceField)
{
	PARAM_ACTION_PROLOGUE;

	self->flags &= ~MF_SPECIAL;

	for (int i = 0; i < self->Sector->linecount; ++i)
	{
		line_t *line = self->Sector->lines[i];
		if (line->backsector != NULL && line->special == ForceField)
		{
			line->flags &= ~(ML_BLOCKING|ML_BLOCKEVERYTHING);
			line->special = 0;
			line->sidedef[0]->SetTexture(side_t::mid, FNullTextureID());
			line->sidedef[1]->SetTexture(side_t::mid, FNullTextureID());
		}
	}
	return 0;
}